

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

wchar_t path_nearest_unknown
                  (player *p,loc_conflict start,loc_conflict *dest_grid,int16_t **step_dirs)

{
  loc_conflict grid1;
  loc grid;
  bool bVar1;
  _Bool _Var2;
  _Bool forbid_traps;
  wchar_t wVar3;
  wchar_t wVar4;
  loc lVar5;
  _Bool only_known;
  pfdistances *a;
  long lVar6;
  chunk_conflict2 *c;
  long lVar7;
  long lVar8;
  bool bVar9;
  wchar_t local_64;
  wchar_t local_5c;
  loc local_58;
  loc local_50;
  pfdistances *local_48;
  int16_t **local_40;
  loc *local_38;
  
  bVar1 = true;
  forbid_traps = true;
  only_known = true;
  local_40 = step_dirs;
  local_38 = (loc *)dest_grid;
  do {
    lVar5 = (loc)loc(-1,-1);
    c = p->cave;
    if (c->height < L'\x01') {
      a = (pfdistances *)0x0;
      bVar9 = true;
    }
    else {
      local_64 = L'\x7fffffff';
      lVar8 = 0;
      lVar6 = 0;
      local_48 = (pfdistances *)0x0;
      local_50 = lVar5;
      do {
        if (L'\0' < p->cave->width) {
          lVar7 = 0;
          do {
            lVar5 = (loc)(lVar8 + lVar7);
            _Var2 = loc_eq((loc_conflict)lVar5,start);
            wVar4 = local_64;
            grid = local_50;
            if ((!_Var2) &&
               (_Var2 = square_isknown((chunk_conflict *)p->cave,lVar5), grid = local_50, _Var2)) {
              if (bVar1) {
                _Var2 = square_ispassable((chunk_conflict *)p->cave,lVar5);
                grid = local_50;
                if ((_Var2) &&
                   (wVar3 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,lVar5,
                                            square_isknown,false), grid = local_50, wVar3 != L'\b'))
                {
                  local_58.x = (wchar_t)lVar7;
                  local_58.y = (wchar_t)lVar6;
LAB_001bb5be:
                  if (local_48 == (pfdistances *)0x0) {
                    local_48 = prepare_pfdistances(p,start,only_known,forbid_traps);
                  }
                  grid.y = local_58.y;
                  grid.x = local_58.x;
                  wVar4 = pfdistances_to_turncount(local_48,(loc_conflict)grid);
                  if (wVar4 < L'\x01' || local_64 <= wVar4) {
                    wVar4 = local_64;
                    grid = local_50;
                  }
                }
              }
              else {
                _Var2 = square_iscloseddoor((chunk_conflict *)p->cave,lVar5);
                if ((((_Var2) ||
                     (_Var2 = square_isrubble((chunk_conflict *)p->cave,lVar5), grid = local_50,
                     _Var2)) &&
                    (wVar3 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,lVar5,
                                             square_isknown,false), grid = local_50, wVar3 != L'\b')
                    ) && ((wVar3 = count_neighbors(&local_58,(chunk_conflict *)p->cave,lVar5,
                                                   square_isknownpassable,false), grid = local_50,
                          wVar3 != L'\0' &&
                          (grid1.y = local_58.y, grid1.x = local_58.x, _Var2 = loc_eq(grid1,start),
                          grid = local_50, !_Var2)))) goto LAB_001bb5be;
              }
            }
            local_50 = grid;
            local_64 = wVar4;
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->cave->width);
        }
        lVar6 = lVar6 + 1;
        c = p->cave;
        lVar8 = lVar8 + 0x100000000;
      } while (lVar6 < c->height);
      bVar9 = local_64 == L'\x7fffffff';
      a = local_48;
      dest_grid = (loc_conflict *)local_38;
      lVar5 = local_50;
    }
    if (bVar9) {
      release_pfdistances(a);
      if ((!forbid_traps) || (_Var2 = player_is_trapsafe(p), _Var2)) {
        if (only_known) {
          forbid_traps = true;
          only_known = false;
          bVar9 = true;
        }
        else {
          if (!bVar1) {
            if ((loc *)dest_grid != (loc *)0x0) {
              lVar5 = (loc)loc(-1,-1);
              *dest_grid = (loc_conflict)lVar5;
            }
            local_5c = L'\xffffffff';
            if (local_40 != (int16_t **)0x0) {
              *local_40 = (int16_t *)0x0;
            }
            goto LAB_001bb700;
          }
          forbid_traps = true;
          bVar1 = false;
          bVar9 = true;
          only_known = true;
        }
      }
      else {
        bVar9 = true;
        forbid_traps = false;
      }
    }
    else {
      if ((a == (pfdistances *)0x0) || (_Var2 = square_in_bounds((chunk_conflict *)c,lVar5), !_Var2)
         ) {
        __assert_fail("distances && square_in_bounds(p->cave, min_grid)",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                      ,0x410,
                      "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                     );
      }
      if ((loc *)dest_grid != (loc *)0x0) {
        *dest_grid = (loc_conflict)lVar5;
      }
      local_5c = pfdistances_to_path(a,(loc_conflict)lVar5,local_40);
      release_pfdistances(a);
      if (local_5c < L'\x01') {
        __assert_fail("path_length > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                      ,0x417,
                      "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                     );
      }
LAB_001bb700:
      bVar9 = false;
    }
    if (!bVar9) {
      return local_5c;
    }
  } while( true );
}

Assistant:

int path_nearest_unknown(struct player *p, struct loc start,
		struct loc *dest_grid, int16_t **step_dirs)
{
	bool only_known = true, forbid_traps = true, passable = true;

	while (1) {
		struct pfdistances *distances = NULL;
		struct loc min_grid = loc(-1, -1);
		int min_turns = INT_MAX;
		struct loc grid;

		for (grid.y = 0; grid.y < p->cave->height; ++grid.y) {
			for (grid.x = 0; grid.x < p->cave->width; ++grid.x) {
				struct loc test_grid;
				int turns;

				if (loc_eq(grid, start)
						|| !square_isknown(p->cave,
						grid)) {
					continue;
				}
				if (passable) {
					if (!square_ispassable(p->cave, grid)
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown, false)
							== 8) {
						continue;
					}
					test_grid = grid;
				} else {
					if ((!square_iscloseddoor(p->cave, grid)
							&& !square_isrubble(
							p->cave, grid))
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown,
							false) == 8) {
						continue;
					}
					if (count_neighbors(&test_grid,
							p->cave, grid,
							square_isknownpassable,
							false) == 0 ||
							loc_eq(test_grid,
							start)) {
						continue;
					}
				}

				if (!distances) {
					distances = prepare_pfdistances(
						p, start, only_known,
						forbid_traps);
				}
				turns = pfdistances_to_turncount(distances,
					test_grid);
				if (turns > 0 && min_turns > turns) {
					min_turns = turns;
					min_grid = test_grid;
				}
			}
		}

		if (min_turns < INT_MAX) {
			int path_length;

			assert(distances
				&& square_in_bounds(p->cave, min_grid));
			if (dest_grid) {
				*dest_grid = min_grid;
			}
			path_length = pfdistances_to_path(distances,
				min_grid, step_dirs);
			release_pfdistances(distances);
			assert(path_length > 0);
			return path_length;
		}

		release_pfdistances(distances);
		/*
		 * No destination was found.  Try looser constraints on the
		 * grids that can be in the path.
		 */
		if (forbid_traps && !player_is_trapsafe(p)) {
			forbid_traps = false;
			continue;
		}
		if (only_known) {
			only_known = false;
			forbid_traps = true;
			continue;
		}
		/*
		 * Looser constraints did not help.  Try looking for known
		 * closed doors or known rubble with unknown neighbors.
		 */
		if (passable) {
			passable = false;
			only_known = true;
			forbid_traps = true;
			continue;
		}
		/* Nothing more to try.  Give up. */
		if (dest_grid) {
			*dest_grid = loc(-1, -1);
		}
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
}